

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

int cmsys::anon_unknown_3::LoadLines
              (FILE *file,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *lines)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  bool bVar4;
  allocator<char> local_451;
  value_type local_450;
  char **local_430;
  char *pBuf;
  char buf [1024];
  int bufSize;
  int nRead;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *lines_local;
  FILE *file_local;
  
  buf[0x3fc] = '\0';
  buf[0x3fd] = '\0';
  buf[0x3fe] = '\0';
  buf[0x3ff] = '\0';
  buf[0x3f8] = '\0';
  buf[0x3f9] = '\x04';
  buf[0x3fa] = '\0';
  buf[0x3fb] = '\0';
  memset(&pBuf,0,0x400);
  while( true ) {
    iVar1 = feof((FILE *)file);
    bVar4 = false;
    if (iVar1 == 0) {
      iVar1 = ferror((FILE *)file);
      bVar4 = iVar1 == 0;
    }
    if (!bVar4) break;
    piVar2 = __errno_location();
    *piVar2 = 0;
    pcVar3 = fgets((char *)&pBuf,0x400,(FILE *)file);
    if (pcVar3 == (char *)0x0) {
      iVar1 = ferror((FILE *)file);
      if ((iVar1 != 0) && (piVar2 = __errno_location(), *piVar2 == 4)) {
        clearerr((FILE *)file);
      }
    }
    else {
      for (local_430 = &pBuf; *(char *)local_430 != '\0'; local_430 = (char **)((long)local_430 + 1)
          ) {
        if (*(char *)local_430 == '\n') {
          *(char *)local_430 = '\0';
        }
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_450,(char *)&pBuf,&local_451);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(lines,&local_450);
      std::__cxx11::string::~string((string *)&local_450);
      std::allocator<char>::~allocator(&local_451);
      buf._1020_4_ = buf._1020_4_ + 1;
    }
  }
  iVar1 = ferror((FILE *)file);
  if (iVar1 == 0) {
    file_local._4_1_ = buf[0x3fc];
    file_local._5_1_ = buf[0x3fd];
    file_local._6_1_ = buf[0x3fe];
    file_local._7_1_ = buf[0x3ff];
  }
  else {
    file_local._4_4_ = 0;
  }
  return file_local._4_4_;
}

Assistant:

int LoadLines(FILE* file, std::vector<std::string>& lines)
{
  // Load each line in the given file into a the vector.
  int nRead = 0;
  const int bufSize = 1024;
  char buf[bufSize] = { '\0' };
  while (!feof(file) && !ferror(file)) {
    errno = 0;
    if (fgets(buf, bufSize, file) == KWSYS_NULLPTR) {
      if (ferror(file) && (errno == EINTR)) {
        clearerr(file);
      }
      continue;
    }
    char* pBuf = buf;
    while (*pBuf) {
      if (*pBuf == '\n')
        *pBuf = '\0';
      pBuf += 1;
    }
    lines.push_back(buf);
    ++nRead;
  }
  if (ferror(file)) {
    return 0;
  }
  return nRead;
}